

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_FindObjectsInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  Token *this_00;
  bool bVar1;
  undefined1 isPrivate_00;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Session *this_01;
  Slot *this_02;
  CK_STATE CVar5;
  HandleManager *this_03;
  reference ppOVar6;
  size_t sVar7;
  ByteString *ctx;
  ulong in_RCX;
  size_t *outlen;
  long in_RDX;
  HandleManager *in_RDI;
  char *in_R8;
  size_t in_R9;
  byte bVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar9;
  CK_OBJECT_HANDLE hObject;
  bool isPrivate;
  bool isOnToken;
  CK_SLOT_ID slotID;
  ByteString bsTemplateValue;
  ByteString bsAttrValue;
  CK_ULONG ulTemplateValue;
  bool bTemplateValue;
  OSAttribute attr;
  CK_ULONG i;
  bool bAttrMatch;
  bool isPrivateObject;
  iterator it;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> handles;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> allObjects;
  FindOperation *findOp;
  Token *token;
  bool isPublicSession;
  Slot *slot;
  Session *session;
  Session *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  _Rb_tree_const_iterator<unsigned_long> in_stack_fffffffffffffd08;
  Session *in_stack_fffffffffffffd10;
  FindOperation *pFVar10;
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  ByteString *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  HandleManager *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  CK_SLOT_ID in_stack_fffffffffffffd78;
  SessionObjectStore *in_stack_fffffffffffffd80;
  CK_VOID_PTR in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdca;
  undefined1 in_stack_fffffffffffffdcb;
  undefined1 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdcd;
  CK_SLOT_ID slotID_00;
  undefined1 *slotID_01;
  CK_OBJECT_HANDLE local_200;
  uchar local_1c0 [40];
  CK_VOID_PTR local_198;
  byte local_18d;
  int local_18c;
  OSAttribute local_188;
  ulong local_e8;
  byte local_da;
  byte local_d9;
  _Self local_d8;
  _Base_ptr local_d0;
  _Rb_tree_const_iterator<OSObject_*> local_c8 [9];
  undefined1 local_80 [48];
  FindOperation *local_50;
  Token *local_48;
  CK_RV local_8;
  
  if (((ulong)in_RDI->handlesMutex & 1) == 0) {
    local_8 = 400;
  }
  else if ((in_RDX == 0) && (in_RCX != 0)) {
    local_8 = 7;
  }
  else {
    this_01 = (Session *)
              HandleManager::getSession
                        (in_stack_fffffffffffffd48,
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (this_01 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      this_02 = Session::getSlot(this_01);
      if (this_02 == (Slot *)0x0) {
        local_8 = 5;
      }
      else {
        CVar5 = Session::getState(in_stack_fffffffffffffcf8);
        bVar8 = (CVar5 | 2) != 3;
        local_48 = Session::getToken(this_01);
        if (local_48 == (Token *)0x0) {
          local_8 = 5;
        }
        else {
          iVar3 = Session::getOpType(this_01);
          if (iVar3 == 0) {
            Session::setOpType(this_01,1);
            local_50 = FindOperation::create();
            if (local_50 == (FindOperation *)0x0) {
              local_8 = 2;
            }
            else {
              slotID_01 = local_80;
              std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::set
                        ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         0x164bd2);
              Token::getObjects((Token *)CONCAT17(in_stack_fffffffffffffd07,
                                                  in_stack_fffffffffffffd00),
                                (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                                 *)in_stack_fffffffffffffcf8);
              slotID_00 = *(CK_SLOT_ID *)&(in_RDI->handles)._M_t._M_impl;
              this_03 = (HandleManager *)Slot::getSlotID(this_02);
              SessionObjectStore::getObjects
                        (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
              std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                        ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x164c40);
              std::_Rb_tree_const_iterator<OSObject_*>::_Rb_tree_const_iterator(local_c8);
              local_d0 = (_Base_ptr)
                         std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::
                         begin((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                                *)in_stack_fffffffffffffcf8);
              local_c8[0]._M_node = local_d0;
              while( true ) {
                local_d8._M_node =
                     (_Base_ptr)
                     std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::end
                               ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                                 *)in_stack_fffffffffffffcf8);
                bVar1 = std::operator!=(local_c8,&local_d8);
                if (!bVar1) break;
                ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                    ((_Rb_tree_const_iterator<OSObject_*> *)
                                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
                uVar4 = (*(*ppOVar6)->_vptr_OSObject[10])();
                isPrivate_00 = (undefined1)uVar4;
                if ((uVar4 & 1) == 0) {
                  in_R8 = "Object is not valid, skipping";
                  softHSMLog(7,"C_FindObjectsInit",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0x7bf);
                }
                else {
                  ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                      ((_Rb_tree_const_iterator<OSObject_*> *)
                                       CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00)
                                      );
                  uVar4 = (*(*ppOVar6)->_vptr_OSObject[4])(*ppOVar6,2,1);
                  bVar2 = (byte)uVar4;
                  local_d9 = bVar2 & 1;
                  if (((bVar8 & 1) == 0) || ((uVar4 & 1) == 0)) {
                    local_da = 1;
                    for (local_e8 = 0; local_e8 < in_RCX; local_e8 = local_e8 + 1) {
                      local_da = 0;
                      ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                          ((_Rb_tree_const_iterator<OSObject_*> *)
                                           CONCAT17(in_stack_fffffffffffffd07,
                                                    in_stack_fffffffffffffd00));
                      uVar4 = (*(*ppOVar6)->_vptr_OSObject[2])
                                        (*ppOVar6,*(undefined8 *)(in_RDX + local_e8 * 0x18));
                      in_stack_fffffffffffffdcd = (undefined1)uVar4;
                      if ((uVar4 & 1) == 0) break;
                      ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                          ((_Rb_tree_const_iterator<OSObject_*> *)
                                           CONCAT17(in_stack_fffffffffffffd07,
                                                    in_stack_fffffffffffffd00));
                      outlen = (size_t *)(local_e8 * 3);
                      (*(*ppOVar6)->_vptr_OSObject[3])
                                (&local_188,*ppOVar6,*(undefined8 *)(in_RDX + local_e8 * 0x18));
                      in_stack_fffffffffffffdcc = OSAttribute::isBooleanAttribute(&local_188);
                      if ((bool)in_stack_fffffffffffffdcc) {
                        if (*(long *)(in_RDX + local_e8 * 0x18 + 0x10) == 1) {
                          local_18d = **(char **)(in_RDX + 8 + local_e8 * 0x18) == '\x01';
                          in_stack_fffffffffffffdcb = OSAttribute::getBooleanValue(&local_188);
                          if (in_stack_fffffffffffffdcb == (local_18d & 1)) {
LAB_0016529f:
                            local_da = 1;
                            local_18c = 0;
                          }
                          else {
                            local_18c = 6;
                          }
                        }
                        else {
                          local_18c = 6;
                        }
                      }
                      else {
                        in_stack_fffffffffffffdca = OSAttribute::isUnsignedLongAttribute(&local_188)
                        ;
                        if ((bool)in_stack_fffffffffffffdca) {
                          if (*(long *)(in_RDX + local_e8 * 0x18 + 0x10) == 8) {
                            local_198 = (CK_VOID_PTR)
                                        **(unsigned_long **)(in_RDX + 8 + local_e8 * 0x18);
                            in_stack_fffffffffffffdc0 =
                                 (CK_VOID_PTR)OSAttribute::getUnsignedLongValue(&local_188);
                            if (in_stack_fffffffffffffdc0 == local_198) goto LAB_0016529f;
                            local_18c = 6;
                          }
                          else {
                            local_18c = 6;
                          }
                        }
                        else {
                          bVar1 = OSAttribute::isByteStringAttribute(&local_188);
                          if (bVar1) {
                            ByteString::ByteString((ByteString *)0x165006);
                            if ((local_d9 & 1) == 0) {
LAB_00165117:
                              OSAttribute::getByteStringValue(&local_188);
                              ByteString::operator=
                                        ((ByteString *)
                                         CONCAT17(in_stack_fffffffffffffd07,
                                                  in_stack_fffffffffffffd00),
                                         (ByteString *)in_stack_fffffffffffffcf8);
LAB_00165147:
                              sVar7 = ByteString::size((ByteString *)0x165154);
                              if (sVar7 == *(size_t *)(in_RDX + local_e8 * 0x18 + 0x10)) {
                                if (*(long *)(in_RDX + local_e8 * 0x18 + 0x10) != 0) {
                                  ByteString::ByteString
                                            (in_stack_fffffffffffffd20,
                                             (uchar *)CONCAT44(in_stack_fffffffffffffd1c,
                                                               in_stack_fffffffffffffd18),
                                             (size_t)in_stack_fffffffffffffd10);
                                  bVar1 = ByteString::operator!=
                                                    ((ByteString *)
                                                     CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18),
                                                     (ByteString *)in_stack_fffffffffffffd10);
                                  if (bVar1) {
                                    local_18c = 6;
                                  }
                                  else {
                                    local_18c = 0;
                                  }
                                  ByteString::~ByteString((ByteString *)0x165249);
                                  if (local_18c != 0) goto LAB_00165263;
                                }
                                local_18c = 0;
                              }
                              else {
                                local_18c = 6;
                              }
                            }
                            else {
                              OSAttribute::getByteStringValue(&local_188);
                              sVar7 = ByteString::size((ByteString *)0x16503a);
                              this_00 = local_48;
                              if (sVar7 == 0) goto LAB_00165117;
                              ctx = OSAttribute::getByteStringValue(&local_188);
                              uVar4 = Token::decrypt(this_00,(EVP_PKEY_CTX *)ctx,local_1c0,outlen,
                                                     (uchar *)in_R8,in_R9);
                              pFVar10 = local_50;
                              if ((uVar4 & 1) != 0) goto LAB_00165147;
                              if (local_50 != (FindOperation *)0x0) {
                                FindOperation::~FindOperation((FindOperation *)0x1650d3);
                                operator_delete(pFVar10);
                              }
                              local_8 = 5;
                              local_18c = 1;
                            }
LAB_00165263:
                            ByteString::~ByteString((ByteString *)0x165270);
                            if (local_18c == 0) goto LAB_0016529f;
                          }
                          else {
                            local_18c = 6;
                          }
                        }
                      }
                      OSAttribute::~OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
                      if (local_18c != 0) {
                        if (local_18c != 6) goto LAB_00165568;
                        break;
                      }
                    }
                    if ((local_da & 1) != 0) {
                      Slot::getSlotID(this_02);
                      ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                          ((_Rb_tree_const_iterator<OSObject_*> *)
                                           CONCAT17(in_stack_fffffffffffffd07,
                                                    in_stack_fffffffffffffd00));
                      uVar4 = (*(*ppOVar6)->_vptr_OSObject[4])(*ppOVar6,1,0);
                      ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                          ((_Rb_tree_const_iterator<OSObject_*> *)
                                           CONCAT17(in_stack_fffffffffffffd07,
                                                    in_stack_fffffffffffffd00));
                      iVar3 = (*(*ppOVar6)->_vptr_OSObject[4])(*ppOVar6,2,1);
                      if ((uVar4 & 1) == 0) {
                        in_stack_fffffffffffffd20 =
                             (ByteString *)
                             (in_RDI->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                        ;
                        in_stack_fffffffffffffd1c = (uint)((byte)iVar3 & 1);
                        ppOVar6 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                            ((_Rb_tree_const_iterator<OSObject_*> *)
                                             CONCAT17(in_stack_fffffffffffffd07,
                                                      in_stack_fffffffffffffd00));
                        in_R8 = (char *)*ppOVar6;
                        local_200 = HandleManager::addSessionObject
                                              (in_RDI,(CK_SLOT_ID)slotID_01,
                                               (CK_SESSION_HANDLE)this_03,SUB81(slotID_00 >> 0x38,0)
                                               ,(CK_VOID_PTR)
                                                CONCAT17(isPrivate_00,
                                                         CONCAT16(bVar2,CONCAT15(
                                                  in_stack_fffffffffffffdcd,
                                                  CONCAT14(in_stack_fffffffffffffdcc,
                                                           CONCAT13(in_stack_fffffffffffffdcb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdca,
                                                  in_stack_fffffffffffffdc8)))))));
                      }
                      else {
                        std::_Rb_tree_const_iterator<OSObject_*>::operator*
                                  ((_Rb_tree_const_iterator<OSObject_*> *)
                                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
                        local_200 = HandleManager::addTokenObject
                                              (this_03,slotID_00,(bool)isPrivate_00,
                                               in_stack_fffffffffffffdc0);
                      }
                      if (local_200 == 0) {
                        if (local_50 != (FindOperation *)0x0) {
                          pFVar10 = local_50;
                          FindOperation::~FindOperation((FindOperation *)0x1654b1);
                          operator_delete(pFVar10);
                        }
                        local_8 = 5;
                        local_18c = 1;
                        goto LAB_00165568;
                      }
                      pVar9 = std::
                              set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                        *)in_stack_fffffffffffffd20,
                                       (value_type *)
                                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                                      );
                      in_stack_fffffffffffffd08 = pVar9.first._M_node;
                      in_stack_fffffffffffffd07 = pVar9.second;
                    }
                  }
                }
                std::_Rb_tree_const_iterator<OSObject_*>::operator++
                          ((_Rb_tree_const_iterator<OSObject_*> *)
                           CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
              }
              FindOperation::setHandles
                        ((FindOperation *)
                         CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)in_stack_fffffffffffffcf8);
              Session::setFindOp(in_stack_fffffffffffffd10,
                                 (FindOperation *)in_stack_fffffffffffffd08._M_node);
              local_8 = 0;
              local_18c = 1;
LAB_00165568:
              std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              ~set((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x165575);
              std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
                        ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         0x165582);
            }
          }
          else {
            local_8 = 0x90;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_FindObjectsInit(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;
	if (pTemplate == NULL_PTR && ulCount != 0) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Determine whether we have a public session or not.
	bool isPublicSession;
	switch (session->getState()) {
		case CKS_RO_USER_FUNCTIONS:
		case CKS_RW_USER_FUNCTIONS:
			isPublicSession = false;
			break;
		default:
			isPublicSession = true;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	session->setOpType(SESSION_OP_FIND);
	FindOperation *findOp = FindOperation::create();

	// Check if we are out of memory
	if (findOp == NULL_PTR) return CKR_HOST_MEMORY;

	std::set<OSObject*> allObjects;
	token->getObjects(allObjects);
	sessionObjectStore->getObjects(slot->getSlotID(),allObjects);

	std::set<CK_OBJECT_HANDLE> handles;
	std::set<OSObject*>::iterator it;
	for (it=allObjects.begin(); it != allObjects.end(); ++it)
	{
		// Refresh object and check if it is valid
		if (!(*it)->isValid()) {
			DEBUG_MSG("Object is not valid, skipping");
			continue;
		}

		// Determine if the object has CKA_PRIVATE set to CK_TRUE
		bool isPrivateObject = (*it)->getBooleanValue(CKA_PRIVATE, true);

		// If the object is private, and we are in a public session then skip it !
		if (isPublicSession && isPrivateObject)
			continue; // skip object

		// Perform the actual attribute matching.
		bool bAttrMatch = true; // We let an empty template match everything.
		for (CK_ULONG i=0; i<ulCount; ++i)
		{
			bAttrMatch = false;

			if (!(*it)->attributeExists(pTemplate[i].type))
				break;

			OSAttribute attr = (*it)->getAttribute(pTemplate[i].type);

			if (attr.isBooleanAttribute())
			{
				if (sizeof(CK_BBOOL) != pTemplate[i].ulValueLen)
					break;
				bool bTemplateValue = (*(CK_BBOOL*)pTemplate[i].pValue == CK_TRUE);
				if (attr.getBooleanValue() != bTemplateValue)
					break;
			}
			else
			{
				if (attr.isUnsignedLongAttribute())
				{
					if (sizeof(CK_ULONG) != pTemplate[i].ulValueLen)
						break;
					CK_ULONG ulTemplateValue = *(CK_ULONG_PTR)pTemplate[i].pValue;
					if (attr.getUnsignedLongValue() != ulTemplateValue)
						break;
				}
				else
				{
					if (attr.isByteStringAttribute())
					{
						ByteString bsAttrValue;
						if (isPrivateObject && attr.getByteStringValue().size() != 0)
						{
							if (!token->decrypt(attr.getByteStringValue(), bsAttrValue))
							{
								delete findOp;
								return CKR_GENERAL_ERROR;
							}
						}
						else
							bsAttrValue = attr.getByteStringValue();

						if (bsAttrValue.size() != pTemplate[i].ulValueLen)
							break;
						if (pTemplate[i].ulValueLen != 0)
						{
							ByteString bsTemplateValue((const unsigned char*)pTemplate[i].pValue, pTemplate[i].ulValueLen);
							if (bsAttrValue != bsTemplateValue)
								break;
						}
					}
					else
						break;
				}
			}
			// The attribute matched !
			bAttrMatch = true;
		}

		if (bAttrMatch)
		{
			CK_SLOT_ID slotID = slot->getSlotID();
			bool isOnToken = (*it)->getBooleanValue(CKA_TOKEN, false);
			bool isPrivate = (*it)->getBooleanValue(CKA_PRIVATE, true);
			// Create an object handle for every returned object.
			CK_OBJECT_HANDLE hObject;
			if (isOnToken)
				hObject = handleManager->addTokenObject(slotID,isPrivate,*it);
			else
				hObject = handleManager->addSessionObject(slotID,hSession,isPrivate,*it);
			if (hObject == CK_INVALID_HANDLE)
			{
				delete findOp;
				return CKR_GENERAL_ERROR;
			}
			handles.insert(hObject);
		}
	}

	// Storing the object handles for the find will protect the library
	// whenever a stale object handle is used to access the library.
	findOp->setHandles(handles);

	session->setFindOp(findOp);

	return CKR_OK;
}